

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void http_handle_dir(nng_http *conn,void *arg,nng_aio *aio)

{
  char cVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  nng_err nVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  nng_http_status status;
  char *pcVar11;
  size_t sz;
  void *local_40;
  void *data;
  size_t size;
  
  pcVar10 = *arg;
  pcVar11 = *(char **)((long)arg + 8);
  pcVar6 = nni_http_get_uri(conn);
  sVar7 = strlen(pcVar10);
  if ((pcVar10[1] == '\0') ||
     ((iVar4 = strncmp(pcVar6,pcVar10,sVar7), iVar4 == 0 &&
      ((pcVar6[sVar7] == '\0' || (pcVar6[sVar7] == '/')))))) {
    sVar8 = strlen(pcVar11);
    sVar9 = strlen(pcVar6);
    sz = sVar8 + sVar9 + 0xd;
    pcVar10 = (char *)nni_alloc(sz);
    if (pcVar10 != (char *)0x0) {
      strcpy(pcVar10,pcVar11);
      sVar8 = strlen(pcVar10);
      pcVar11 = pcVar10 + sVar8;
      if ((sVar8 == 0) || (pcVar11[-1] != '/')) {
        *pcVar11 = '/';
        pcVar11 = pcVar11 + 1;
      }
      pcVar6 = pcVar6 + sVar7;
      do {
        cVar1 = *pcVar6;
        if (cVar1 == '/') {
          pcVar11[0] = '/';
          pcVar11[1] = '\0';
        }
        else {
          if ((cVar1 == '\0') || (cVar1 == '?')) goto LAB_00137cb2;
          *pcVar11 = cVar1;
        }
        pcVar11 = pcVar11 + 1;
        pcVar6 = pcVar6 + 1;
      } while( true );
    }
    nVar5 = NNG_ENOMEM;
  }
  else {
    nVar5 = NNG_EINVAL;
  }
  nni_aio_finish_error(aio,nVar5);
  return;
LAB_00137cb2:
  *pcVar11 = '\0';
  _Var2 = nni_file_is_dir(pcVar10);
  _Var3 = true;
  iVar4 = 0;
  if (_Var2) {
    sVar7 = strlen(pcVar10);
    snprintf(pcVar11,sz - sVar7,"%s%s","/","index.html");
    _Var2 = nni_file_is_file(pcVar10);
    iVar4 = 0;
    if (!_Var2) {
      sVar7 = strlen(pcVar10);
      pcVar10[sVar7 - 1] = '\0';
      _Var3 = nni_file_is_file(pcVar10);
      iVar4 = 0xc;
      if (_Var3) {
        iVar4 = 0;
      }
    }
  }
  if (_Var3 == false) {
    local_40 = (void *)0x0;
    data = (void *)0x0;
  }
  else {
    iVar4 = nni_file_get(pcVar10,&local_40,(size_t *)&data);
  }
  pcVar11 = http_lookup_type(pcVar10);
  nni_free(pcVar10,sz);
  if (iVar4 == 0) {
    pcVar10 = "application/octet-stream";
    if (pcVar11 != (char *)0x0) {
      pcVar10 = pcVar11;
    }
    nVar5 = nng_http_set_header(conn,"Content-Type",pcVar10);
    if ((nVar5 == NNG_OK) &&
       (nVar5 = nng_http_copy_body(conn,local_40,(size_t)data), nVar5 == NNG_OK)) {
      nng_http_set_status(conn,NNG_HTTP_STATUS_OK,(char *)0x0);
      nni_free(local_40,(size_t)data);
      goto LAB_00137e37;
    }
    nni_free(local_40,(size_t)data);
  }
  else {
    if (iVar4 == 0x10) {
      status = NNG_HTTP_STATUS_FORBIDDEN;
    }
    else {
      status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
      if (iVar4 == 0xc) {
        status = NNG_HTTP_STATUS_NOT_FOUND;
      }
    }
    nVar5 = nni_http_set_error(conn,status,(char *)0x0,(char *)0x0);
    if (nVar5 == NNG_OK) {
LAB_00137e37:
      nni_aio_finish(aio,NNG_OK,0);
      return;
    }
  }
  nni_aio_finish_error(aio,nVar5);
  return;
}

Assistant:

static void
http_handle_dir(nng_http *conn, void *arg, nng_aio *aio)
{
	void       *data;
	size_t      size;
	nng_err     rv;
	http_file  *hf   = arg;
	const char *path = hf->path;
	const char *base = hf->base;
	const char *uri  = nni_http_get_uri(conn);
	const char *ctype;
	char       *dst;
	size_t      len;
	size_t      pnsz;
	char       *pn;

	len = strlen(base);
	if (base[1] != '\0' && // Allows "/" as base
	    ((strncmp(uri, base, len) != 0) ||
	        ((uri[len] != 0) && (uri[len] != '/')))) {
		// This should never happen!
		nni_aio_finish_error(aio, NNG_EINVAL);
		return;
	}

	// simple worst case is every character in path is a separator
	// It's never actually that bad, because we we have /<something>/.
	pnsz = (strlen(path) + strlen(uri) + 2) * strlen(NNG_PLATFORM_DIR_SEP);
	pnsz += strlen("index.html") + 1; // +1 for term nul

	if ((pn = nni_alloc(pnsz)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}

	// make sure we have a "/" present.
	strcpy(pn, path);
	dst = pn + strlen(pn);

	if ((dst == pn) || (dst[-1] != '/')) {
		*dst++ = '/';
	}

	for (uri = uri + len; *uri != '\0'; uri++) {
		if (*uri == '?') {
			// Skip URI parameters
			break;
		} else if (*uri == '/') {
			strcpy(dst, NNG_PLATFORM_DIR_SEP);
			dst += sizeof(NNG_PLATFORM_DIR_SEP) - 1;
		} else {
			*dst++ = *uri;
		}
	}

	*dst = '\0';

	// This is a very simplistic file server, suitable only for small
	// files.  In the future we can use an AIO based file read, where
	// we read files a bit at a time, or even mmap them, and serve
	// them up chunkwise.  Applications could even come up with their
	// own caching version of the http handler.

	rv = 0;
	if (nni_file_is_dir(pn)) {
		snprintf(dst, pnsz - strlen(pn), "%s%s", NNG_PLATFORM_DIR_SEP,
		    "index.html");
		if (!nni_file_is_file(pn)) {
			pn[strlen(pn) - 1] = '\0'; // index.html -> index.htm
			if (!nni_file_is_file(pn)) {
				rv = NNG_ENOENT;
			}
		}
	}

	if (rv == NNG_OK) {
		rv = nni_file_get(pn, &data, &size);
	} else {
		data = NULL;
		size = 0;
	}
	ctype = http_lookup_type(pn);
	if (ctype == NULL) {
		ctype = "application/octet-stream";
	}

	nni_free(pn, pnsz);
	if (rv != NNG_OK) {
		nng_http_status status;

		switch (rv) {
		case NNG_ENOMEM:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		case NNG_ENOENT:
			status = NNG_HTTP_STATUS_NOT_FOUND;
			break;
		case NNG_EPERM:
			status = NNG_HTTP_STATUS_FORBIDDEN;
			break;
		default:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		}
		if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
		nni_aio_finish(aio, 0, 0);
		return;
	}

	if (((rv = nng_http_set_header(conn, "Content-Type", ctype)) != 0) ||
	    ((rv = nng_http_copy_body(conn, data, size)) != 0)) {
		nni_free(data, size);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_OK, NULL);

	nni_free(data, size);
	nni_aio_finish(aio, NNG_OK, 0);
}